

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f2c_lite.c
# Opt level: O0

int s_stop(char *s,ftnlen n)

{
  int local_18;
  int i;
  ftnlen n_local;
  char *s_local;
  
  if (0 < n) {
    fprintf(_stderr,"STOP ");
    _i = s;
    for (local_18 = 0; local_18 < n; local_18 = local_18 + 1) {
      putc((int)*_i,_stderr);
      _i = _i + 1;
    }
    fprintf(_stderr," statement executed\n");
  }
  exit(0);
}

Assistant:

int s_stop(char *s, ftnlen n)
#endif
        {
            int i;

            if (n > 0) {
                fprintf(stderr, "STOP ");
                for (i = 0; i < n; ++i)
                    putc(*s++, stderr);
                fprintf(stderr, " statement executed\n");
            }
#ifdef NO_ONEXIT
            f_exit();
#endif
             exit(0);

/* We cannot avoid (useless) compiler diagnostics here:		*/
/* some compilers complain if there is no return statement,	*/
/* and others complain that this one cannot be reached.		*/

             return 0;          /* NOT REACHED */
        }